

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> * __thiscall
prometheus::Registry::Collect
          (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
           *__return_storage_ptr__,Registry *this)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  Registry *this_local;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *results;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::vector
            (__return_storage_ptr__);
  (anonymous_namespace)::
  CollectAll<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>>
            (__return_storage_ptr__,&this->counters_);
  (anonymous_namespace)::
  CollectAll<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>>
            (__return_storage_ptr__,&this->gauges_);
  (anonymous_namespace)::
  CollectAll<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>>
            (__return_storage_ptr__,&this->histograms_);
  (anonymous_namespace)::
  CollectAll<std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>>
            (__return_storage_ptr__,&this->infos_);
  (anonymous_namespace)::
  CollectAll<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>
            (__return_storage_ptr__,&this->summaries_);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<MetricFamily> Registry::Collect() const {
  std::lock_guard<std::mutex> lock{mutex_};
  auto results = std::vector<MetricFamily>{};

  CollectAll(results, counters_);
  CollectAll(results, gauges_);
  CollectAll(results, histograms_);
  CollectAll(results, infos_);
  CollectAll(results, summaries_);

  return results;
}